

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,StackVar *t,char (*u) [2],Newline *args)

{
  string_view local_38;
  Newline *local_28;
  Newline *args_local;
  char (*u_local) [2];
  StackVar *t_local;
  CWriter *this_local;
  
  local_28 = args;
  args_local = (Newline *)u;
  u_local = (char (*) [2])t;
  t_local = (StackVar *)this;
  anon_unknown_0::CWriter::Write((CWriter *)this,t);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,(char *)args_local);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_38);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }